

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O2

size_t fiobj_json2obj(FIOBJ *pobj,void *data,size_t len)

{
  size_t sVar1;
  FIOBJ o;
  fiobj_json_parser_s p;
  json_parser_s local_68;
  FIOBJ FStack_60;
  FIOBJ local_58;
  undefined8 uStack_50;
  fio_json_stack_s local_48;
  undefined8 local_28;
  
  local_48.capa = 0;
  local_48.arry = (FIOBJ *)0x0;
  local_48.start = 0;
  local_48.end = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68.dict = 0;
  local_68.depth = '\0';
  local_68.key = '\0';
  local_68._6_2_ = 0;
  FStack_60 = 0;
  local_28 = 0;
  sVar1 = fio_json_parse(&local_68,(char *)data,len);
  if ((sVar1 == 0) || (local_68.depth != '\0')) {
    if (local_48.end == local_48.start) {
      o = 0;
    }
    else {
      o = local_48.arry[local_48.start];
    }
    fiobj_free(o);
    local_58 = 0;
  }
  fio_json_stack_free(&local_48);
  fiobj_free(FStack_60);
  *pobj = local_58;
  return sVar1;
}

Assistant:

size_t fiobj_json2obj(FIOBJ *pobj, const void *data, size_t len) {
  fiobj_json_parser_s p = {.top = FIOBJ_INVALID};
  size_t consumed = fio_json_parse(&p.p, data, len);
  if (!consumed || p.p.depth) {
    fiobj_free(fio_json_stack_get(&p.stack, 0));
    p.top = FIOBJ_INVALID;
  }
  fio_json_stack_free(&p.stack);
  fiobj_free(p.key);
  *pobj = p.top;
  return consumed;
}